

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializePreGlobal(ScriptContext *this)

{
  bool bVar1;
  BackgroundParser *pBVar2;
  NativeCodeGenerator *pNVar3;
  HeapAllocator *alloc;
  JITPageAddrToFuncRangeCache *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_01;
  ArenaAllocator *alloc_00;
  TrackAllocData local_90;
  code *local_48;
  undefined8 local_40;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,ParallelParsePhase);
  if (bVar1) {
    pBVar2 = BackgroundParser::New(this);
    this->backgroundParser = pBVar2;
  }
  pNVar3 = NewNativeCodeGenerator(this);
  this->nativeCodeGen = pNVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&JITPageAddrToFuncRangeCache::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x51b);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  local_48 = Memory::HeapAllocator::Alloc;
  local_40 = 0;
  this_00 = (JITPageAddrToFuncRangeCache *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
  JITPageAddrToFuncRangeCache::JITPageAddrToFuncRangeCache(this_00);
  this->jitFuncRangeCache = this_00;
  CreateProfiler(this);
  pAVar4 = &GeneralAllocator(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,
             (type_info *)
             &JsUtil::Stack<void*,Memory::ArenaAllocator,false,DefaultComparer>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x522);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_90);
  this_01 = (Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
            new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar4,0x3f67b0);
  alloc_00 = GeneralAllocator(this);
  JsUtil::Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack(this_01,alloc_00);
  this->operationStack = this_01;
  return;
}

Assistant:

void ScriptContext::InitializePreGlobal()
    {
#if ENABLE_BACKGROUND_PARSING
        if (PHASE_ON1(Js::ParallelParsePhase))
        {
            this->backgroundParser = BackgroundParser::New(this);
        }
#endif

#if ENABLE_NATIVE_CODEGEN
        // Create the native code gen before the profiler
        this->nativeCodeGen = NewNativeCodeGenerator(this);
        this->jitFuncRangeCache = HeapNew(JITPageAddrToFuncRangeCache);
#endif

#ifdef PROFILE_EXEC
        this->CreateProfiler();
#endif

        this->operationStack = Anew(GeneralAllocator(), JsUtil::Stack<Var>, GeneralAllocator());
    }